

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.cpp
# Opt level: O0

unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> __thiscall
Diligent::CopyPSOCreateInternalInfo(Diligent *this,void *pData)

{
  pointer puVar1;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_28;
  undefined1 local_19;
  undefined4 *local_18;
  void *pData_local;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *pCopy;
  
  local_19 = 0;
  local_18 = (undefined4 *)pData;
  pData_local = this;
  std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>::
  unique_ptr<std::default_delete<unsigned_char[]>,void>
            ((unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>> *)this);
  if (local_18 != (undefined4 *)0x0) {
    std::make_unique<unsigned_char[]>((size_t)&local_28);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this,&local_28)
    ;
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(&local_28);
    puVar1 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)this);
    *(undefined4 *)puVar1 = *local_18;
  }
  return (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)
         (__uniq_ptr_data<unsigned_char,_std::default_delete<unsigned_char[]>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Uint8[]> CopyPSOCreateInternalInfo(void* pData)
{
    std::unique_ptr<Uint8[]> pCopy;
    if (pData != nullptr)
    {
        static_assert(std::is_trivially_destructible<PSOCreateInternalInfo>::value, "PSOCreateInternalInfo must be trivially destructible");
        pCopy = std::make_unique<Uint8[]>(sizeof(PSOCreateInternalInfo));
        memcpy(pCopy.get(), pData, sizeof(PSOCreateInternalInfo));
    }

    return pCopy;
}